

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

float duckdb::CheckApproxQuantile(Value *quantile_val)

{
  BinderException *pBVar1;
  float fVar2;
  allocator local_39;
  string local_38 [32];
  
  if (quantile_val[0x18] == (Value)0x1) {
    pBVar1 = (BinderException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string(local_38,"APPROXIMATE QUANTILE parameter cannot be NULL",&local_39)
    ;
    duckdb::BinderException::BinderException(pBVar1,local_38);
    __cxa_throw(pBVar1,&BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  fVar2 = duckdb::Value::GetValue<float>();
  if ((0.0 <= fVar2) && (fVar2 <= 1.0)) {
    return fVar2;
  }
  pBVar1 = (BinderException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            (local_38,"APPROXIMATE QUANTILE can only take parameters in range [0, 1]",&local_39);
  duckdb::BinderException::BinderException(pBVar1,local_38);
  __cxa_throw(pBVar1,&BinderException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static float CheckApproxQuantile(const Value &quantile_val) {
	if (quantile_val.IsNull()) {
		throw BinderException("APPROXIMATE QUANTILE parameter cannot be NULL");
	}
	auto quantile = quantile_val.GetValue<float>();
	if (quantile < 0 || quantile > 1) {
		throw BinderException("APPROXIMATE QUANTILE can only take parameters in range [0, 1]");
	}

	return quantile;
}